

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Client::process_request
          (Client *this,Stream *strm,Request *req,Response *res,bool last_connection,
          bool *connection_close)

{
  Response *x;
  Request *strm_00;
  bool bVar1;
  unsigned_long payload_max_length;
  bool local_109;
  function<bool_(const_char_*,_unsigned_long)> local_e8;
  function<bool_(unsigned_long,_unsigned_long)> local_c8;
  int local_a4;
  anon_class_8_1_ba1d73fe aStack_a0;
  int dummy_status;
  anon_class_8_1_ba1d7400 local_98;
  undefined1 local_90 [8];
  ContentReceiver out;
  string local_60;
  bool *local_40;
  bool *connection_close_local;
  Response *pRStack_30;
  bool last_connection_local;
  Response *res_local;
  Request *req_local;
  Stream *strm_local;
  Client *this_local;
  
  local_40 = connection_close;
  connection_close_local._7_1_ = last_connection;
  pRStack_30 = res;
  res_local = (Response *)req;
  req_local = (Request *)strm;
  strm_local = (Stream *)this;
  write_request(this,strm,req,last_connection);
  bVar1 = read_response_line(this,(Stream *)req_local,pRStack_30);
  if ((bVar1) && (bVar1 = detail::read_headers((Stream *)req_local,&pRStack_30->headers), bVar1)) {
    Response::get_header_value_abi_cxx11_(&local_60,pRStack_30,"Connection",0);
    bVar1 = std::operator==(&local_60,"close");
    local_109 = true;
    if (!bVar1) {
      local_109 = std::operator==(&pRStack_30->version,"HTTP/1.0");
    }
    std::__cxx11::string::~string((string *)&local_60);
    if (local_109 != false) {
      *local_40 = true;
    }
    bVar1 = std::function::operator_cast_to_bool
                      ((function *)
                       &res_local[1].content_provider_resource_releaser.super__Function_base.
                        _M_manager);
    if ((!bVar1) ||
       (bVar1 = std::function<bool_(const_httplib::Response_&)>::operator()
                          ((function<bool_(const_httplib::Response_&)> *)
                           &res_local[1].content_provider_resource_releaser.super__Function_base.
                            _M_manager,pRStack_30), bVar1)) {
      bVar1 = std::operator!=(&res_local->version,"HEAD");
      if (bVar1) {
        local_98.res = pRStack_30;
        std::function<bool(char_const*,unsigned_long)>::
        function<httplib::Client::process_request(httplib::Stream&,httplib::Request_const&,httplib::Response&,bool,bool&)::_lambda(char_const*,unsigned_long)_1_,void>
                  ((function<bool(char_const*,unsigned_long)> *)local_90,&local_98);
        bVar1 = std::function::operator_cast_to_bool
                          ((function *)res_local[2].version.field_2._M_local_buf);
        if (bVar1) {
          aStack_a0.req = (Request *)res_local;
          std::function<bool(char_const*,unsigned_long)>::operator=
                    ((function<bool(char_const*,unsigned_long)> *)local_90,&stack0xffffffffffffff60)
          ;
        }
        strm_00 = req_local;
        x = pRStack_30;
        payload_max_length = std::numeric_limits<unsigned_long>::max();
        std::function<bool_(unsigned_long,_unsigned_long)>::function
                  (&local_c8,
                   (function<bool_(unsigned_long,_unsigned_long)> *)
                   &res_local[2].headers._M_t._M_impl.super__Rb_tree_header);
        std::function<bool_(const_char_*,_unsigned_long)>::function
                  (&local_e8,(function<bool_(const_char_*,_unsigned_long)> *)local_90);
        bVar1 = detail::read_content<httplib::Response>
                          ((Stream *)strm_00,x,payload_max_length,&local_a4,&local_c8,&local_e8);
        std::function<bool_(const_char_*,_unsigned_long)>::~function(&local_e8);
        std::function<bool_(unsigned_long,_unsigned_long)>::~function(&local_c8);
        bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
        if (bVar1) {
          this_local._7_1_ = 0;
        }
        std::function<bool_(const_char_*,_unsigned_long)>::~function
                  ((function<bool_(const_char_*,_unsigned_long)> *)local_90);
        if (bVar1) goto LAB_001d0c8f;
      }
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_001d0c8f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool Client::process_request(Stream &strm, const Request &req,
                                    Response &res, bool last_connection,
                                    bool &connection_close) {
  // Send request
  write_request(strm, req, last_connection);

  // Receive response and headers
  if (!read_response_line(strm, res) ||
      !detail::read_headers(strm, res.headers)) {
    return false;
  }

  if (res.get_header_value("Connection") == "close" ||
      res.version == "HTTP/1.0") {
    connection_close = true;
  }

  if (req.response_handler) {
    if (!req.response_handler(res)) { return false; }
  }

  // Body
  if (req.method != "HEAD") {
    ContentReceiver out = [&](const char *buf, size_t n) {
      if (res.body.size() + n > res.body.max_size()) { return false; }
      res.body.append(buf, n);
      return true;
    };

    if (req.content_receiver) {
      out = [&](const char *buf, size_t n) {
        return req.content_receiver(buf, n);
      };
    }

    int dummy_status;
    if (!detail::read_content(strm, res, std::numeric_limits<size_t>::max(),
                              dummy_status, req.progress, out)) {
      return false;
    }
  }

  return true;
}